

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O1

void ngram_search_save_bp(ngram_search_t *ngs,int frame_idx,int32 w,int32 score,int32 path,int32 rc)

{
  short sVar1;
  short sVar2;
  dictword_t *pdVar3;
  s3cipid_t *psVar4;
  bptbl_t *pbVar5;
  int32 *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  
  iVar9 = ngs->word_lat_idx[w];
  lVar14 = (long)iVar9;
  if (lVar14 == -1) {
    if (ngs->bpidx == -1) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x1bc,"No entries in backpointer table!");
      return;
    }
    iVar9 = ngs->bp_table_size;
    if (iVar9 <= ngs->bpidx) {
      ngs->bp_table_size = iVar9 * 2;
      pbVar5 = (bptbl_t *)
               __ckd_realloc__(ngs->bp_table,(long)iVar9 * 0x48,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                               ,0x1c5);
      ngs->bp_table = pbVar5;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x1c6,"Resized backpointer table to %d entries\n",(ulong)(uint)ngs->bp_table_size);
    }
    iVar9 = ngs->bscore_stack_size;
    if (iVar9 - ((ngs->base).acmod)->mdef->n_ciphone <= ngs->bss_head) {
      ngs->bscore_stack_size = iVar9 * 2;
      piVar6 = (int32 *)__ckd_realloc__(ngs->bscore_stack,(long)iVar9 << 3,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                        ,0x1cd);
      ngs->bscore_stack = piVar6;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x1ce,"Resized score stack to %d entries\n",(ulong)(uint)ngs->bscore_stack_size);
    }
    ngs->word_lat_idx[w] = ngs->bpidx;
    pbVar5 = ngs->bp_table;
    iVar9 = ngs->bpidx;
    pbVar5[iVar9].wid = w;
    pbVar5[iVar9].frame = frame_idx;
    pbVar5[iVar9].bp = path;
    pbVar5[iVar9].score = score;
    pbVar5[iVar9].s_idx = ngs->bss_head;
    pbVar5[iVar9].valid = '\x01';
    if (iVar9 == path) {
      __assert_fail("path != ngs->bpidx",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                    ,0x1d9,
                    "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)");
    }
    pdVar3 = ((ngs->base).dict)->word;
    psVar4 = pdVar3[w].ciphone;
    lVar14 = (long)pdVar3[w].pronlen;
    sVar1 = psVar4[lVar14 + -1];
    pbVar5[iVar9].last_phone = sVar1;
    if (lVar14 == 1) {
      pbVar5[iVar9].last2_phone = -1;
      pbVar5[iVar9].s_idx = -1;
      iVar9 = 0;
    }
    else {
      sVar2 = psVar4[lVar14 + -2];
      pbVar5[iVar9].last2_phone = sVar2;
      iVar9 = ((ngs->base).d2p)->rssid[sVar1][sVar2].n_ssid;
    }
    if (0 < iVar9) {
      piVar6 = ngs->bscore_stack;
      lVar14 = 0;
      do {
        piVar6[ngs->bss_head + lVar14] = -0x20000000;
        lVar14 = lVar14 + 1;
      } while (iVar9 != (int)lVar14);
    }
    if (iVar9 != 0) {
      ngs->bscore_stack[(long)rc + (long)ngs->bss_head] = score;
    }
    set_real_wid(ngs,ngs->bpidx);
    ngs->bpidx = ngs->bpidx + 1;
    ngs->bss_head = ngs->bss_head + iVar9;
  }
  else {
    uVar13 = frame_idx - ngs->bp_table[path].frame;
    if (2000 < (int)uVar13) {
      if (w < 0) {
        pcVar12 = (char *)0x0;
      }
      else {
        pcVar12 = ((ngs->base).dict)->word[w].word;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
              ,0x187,"Word \'%s\' survived for %d frames, potential overpruning\n",pcVar12,
              (ulong)uVar13);
    }
    pbVar5 = ngs->bp_table;
    if (pbVar5[lVar14].score < score) {
      if (iVar9 == path) {
        __assert_fail("path != bp",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                      ,0x18e,
                      "void ngram_search_save_bp(ngram_search_t *, int, int32, int32, int32, int32)"
                     );
      }
      iVar11 = pbVar5[lVar14].bp;
      if (iVar11 != path) {
        iVar7 = -1;
        iVar8 = -1;
        if (iVar11 != -1) {
          iVar8 = pbVar5[iVar11].prev_real_wid;
        }
        if ((long)pbVar5[lVar14].bp != -1) {
          iVar7 = pbVar5[pbVar5[lVar14].bp].real_wid;
        }
        iVar10 = -1;
        iVar11 = -1;
        if (path != -1) {
          iVar11 = pbVar5[path].prev_real_wid;
          iVar10 = pbVar5[path].real_wid;
        }
        if ((iVar8 != iVar11) || (iVar7 != iVar10)) {
          set_real_wid(ngs,iVar9);
        }
        ngs->bp_table[lVar14].bp = path;
      }
      ngs->bp_table[lVar14].score = score;
    }
    iVar9 = ngs->bp_table[lVar14].s_idx;
    if (iVar9 != -1) {
      ngs->bscore_stack[iVar9 + rc] = score;
    }
  }
  return;
}

Assistant:

void
ngram_search_save_bp(ngram_search_t *ngs, int frame_idx,
                     int32 w, int32 score, int32 path, int32 rc)
{
    int32 bp;

    /* Look for an existing exit for this word in this frame.  The
     * only reason one would exist is from a different right context
     * triphone, but of course that happens quite frequently. */
    bp = ngs->word_lat_idx[w];
    if (bp != NO_BP) {

        if (frame_idx - ngs->bp_table[path].frame > NGRAM_HISTORY_LONG_WORD) {
    	    E_WARN("Word '%s' survived for %d frames, potential overpruning\n", dict_wordstr(ps_search_dict(ngs), w),
	    	    frame_idx - ngs->bp_table[path].frame);
	}

        /* Keep only the best scoring one, we will reconstruct the
         * others from the right context scores - usually the history
         * is not lost. */
        if (ngs->bp_table[bp].score WORSE_THAN score) {
            assert(path != bp); /* Pathological. */
            if (ngs->bp_table[bp].bp != path) {
                int32 bplh[2], newlh[2];
                /* But, sometimes, the history *is* lost.  If we wanted to
                 * do exact language model scoring we'd have to preserve
                 * these alternate histories. */
                E_DEBUG("Updating path history %d => %d frame %d\n",
                        ngs->bp_table[bp].bp, path, frame_idx);
                bplh[0] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].prev_real_wid;
                bplh[1] = ngs->bp_table[bp].bp == -1
                    ? -1 : ngs->bp_table[ngs->bp_table[bp].bp].real_wid;
                newlh[0] = path == -1
                    ? -1 : ngs->bp_table[path].prev_real_wid;
                newlh[1] = path == -1
                    ? -1 : ngs->bp_table[path].real_wid;
                /* Actually it's worth checking how often the actual
                 * language model state changes. */
                if (bplh[0] != newlh[0] || bplh[1] != newlh[1]) {
                    /* It's fairly rare that the actual language model
                     * state changes, but it does happen some
                     * times. */
                    E_DEBUG("Updating language model state %s,%s => %s,%s frame %d\n",
                                dict_wordstr(ps_search_dict(ngs), bplh[0]),
                                dict_wordstr(ps_search_dict(ngs), bplh[1]),
                                dict_wordstr(ps_search_dict(ngs), newlh[0]),
                                dict_wordstr(ps_search_dict(ngs), newlh[1]),
                                frame_idx);
                    set_real_wid(ngs, bp);
                }
                ngs->bp_table[bp].bp = path;
            }
            ngs->bp_table[bp].score = score;
        }
        /* But do keep track of scores for all right contexts, since
         * we need them to determine the starting path scores for any
         * successors of this word exit. */
        if (ngs->bp_table[bp].s_idx != -1)
            ngs->bscore_stack[ngs->bp_table[bp].s_idx + rc] = score;
    }
    else {
        int32 i, rcsize;
        bptbl_t *be;

        /* This might happen if recognition fails. */
        if (ngs->bpidx == NO_BP) {
            E_ERROR("No entries in backpointer table!");
            return;
        }

        /* Expand the backpointer tables if necessary. */
        if (ngs->bpidx >= ngs->bp_table_size) {
            ngs->bp_table_size *= 2;
            ngs->bp_table = ckd_realloc(ngs->bp_table,
                                        ngs->bp_table_size
                                        * sizeof(*ngs->bp_table));
            E_INFO("Resized backpointer table to %d entries\n", ngs->bp_table_size);
        }
        if (ngs->bss_head >= ngs->bscore_stack_size
            - bin_mdef_n_ciphone(ps_search_acmod(ngs)->mdef)) {
            ngs->bscore_stack_size *= 2;
            ngs->bscore_stack = ckd_realloc(ngs->bscore_stack,
                                            ngs->bscore_stack_size
                                            * sizeof(*ngs->bscore_stack));
            E_INFO("Resized score stack to %d entries\n", ngs->bscore_stack_size);
        }

        ngs->word_lat_idx[w] = ngs->bpidx;
        be = &(ngs->bp_table[ngs->bpidx]);
        be->wid = w;
        be->frame = frame_idx;
        be->bp = path;
        be->score = score;
        be->s_idx = ngs->bss_head;
        be->valid = TRUE;
        assert(path != ngs->bpidx);

        /* DICT2PID */
        /* Get diphone ID for final phone and number of ssids corresponding to it. */
        be->last_phone = dict_last_phone(ps_search_dict(ngs),w);
        if (dict_is_single_phone(ps_search_dict(ngs), w)) {
            be->last2_phone = -1;
            be->s_idx = -1;
            rcsize = 0;
        }
        else {
            be->last2_phone = dict_second_last_phone(ps_search_dict(ngs),w);
            rcsize = dict2pid_rssid(ps_search_dict2pid(ngs),
                                    be->last_phone, be->last2_phone)->n_ssid;
        }
        /* Allocate some space on the bscore_stack for all of these triphones. */
        for (i = 0; i < rcsize; ++i)
            ngs->bscore_stack[ngs->bss_head + i] = WORST_SCORE;
        if (rcsize)
            ngs->bscore_stack[ngs->bss_head + rc] = score;
        set_real_wid(ngs, ngs->bpidx);

        ngs->bpidx++;
        ngs->bss_head += rcsize;
    }
}